

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O0

void predict_or_learn<false,true>(cs_active *cs_a,single_learner *base,example *ec)

{
  float fVar1;
  ulong uVar2;
  ostream *poVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  float *pfVar6;
  wclass **ppwVar7;
  lq_data **pplVar8;
  void *this;
  long in_RDX;
  float *in_RDI;
  float fVar9;
  float fVar10;
  double dVar11;
  __type_conflict _Var12;
  float fVar13;
  uint32_t i_1;
  bool temp3;
  bool temp2;
  float temp;
  bool query_label;
  lq_data *lqd_2;
  lq_data *__end2_3;
  lq_data *__begin2_3;
  v_array<lq_data> *__range2_3;
  size_t queries;
  bool query;
  lq_data *lqd_1;
  lq_data *__end2_2;
  lq_data *__begin2_2;
  v_array<lq_data> *__range2_2;
  lq_data *lqd;
  lq_data *__end2_1;
  lq_data *__begin2_1;
  v_array<lq_data> *__range2_1;
  uint32_t n_overlapped;
  lq_data f;
  wclass *cl;
  wclass *__end2;
  wclass *__begin2;
  v_array<COST_SENSITIVE::wclass> *__range2;
  float delta;
  float eta;
  float t_prev;
  float t;
  float min_max_cost;
  float score;
  uint32_t prediction;
  size_t i;
  stringstream filename;
  label ld;
  lq_data *in_stack_fffffffffffffc08;
  uint in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  example *in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc28;
  byte in_stack_fffffffffffffc29;
  undefined1 in_stack_fffffffffffffc2a;
  byte bVar14;
  byte in_stack_fffffffffffffc2b;
  float eta_00;
  float fVar15;
  string *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  float in_stack_fffffffffffffc54;
  float local_3a4;
  ostream *in_stack_fffffffffffffc60;
  float local_384;
  float local_2f0;
  undefined1 local_2ea;
  byte local_2e9;
  float local_2e8;
  byte local_2e1;
  lq_data *local_2e0;
  lq_data *local_2d8;
  lq_data *local_2d0;
  v_array<lq_data> *local_2c8;
  long local_2c0;
  byte local_2b1;
  float local_2b0;
  float local_2ac;
  lq_data *local_2a8;
  lq_data *local_2a0;
  lq_data *local_298;
  v_array<lq_data> *local_290;
  lq_data *local_288;
  lq_data *local_280;
  lq_data *local_278;
  v_array<lq_data> *local_270;
  uint local_264;
  undefined4 local_260;
  undefined4 local_25c;
  undefined1 local_258;
  undefined1 local_257;
  undefined1 local_256;
  wclass *local_250;
  wclass *local_248;
  wclass *local_240;
  wclass *local_238;
  v_array<COST_SENSITIVE::wclass> *local_230;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210 [5];
  uint local_1fc;
  ulong local_1f8;
  string local_1f0 [48];
  stringstream local_1c0 [16];
  ostream local_1b0;
  v_array<COST_SENSITIVE::wclass> local_38;
  long local_18;
  float *local_8;
  
  local_38._begin = *(wclass **)(in_RDX + 0x6828);
  local_38._end = *(wclass **)(in_RDX + 0x6830);
  local_38.end_array = *(wclass **)(in_RDX + 0x6838);
  local_38.erase_count = *(size_t *)(in_RDX + 0x6840);
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (*(long *)(in_RDI + 8) * (ulong)(uint)in_RDI[4] <= *(ulong *)**(undefined8 **)(in_RDI + 0xe)) {
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar3 = std::operator<<(&local_1b0,(string *)(*(long *)(local_8 + 0xe) + 0x3570));
    poVar3 = std::operator<<(poVar3,".");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(local_18 + 0x6898));
    poVar3 = std::operator<<(poVar3,".");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)**(undefined8 **)(local_8 + 0xe));
    poVar3 = std::operator<<(poVar3,".");
    std::ostream::operator<<(poVar3,*(ulong *)(local_8 + 0x1a));
    std::__cxx11::stringstream::str();
    VW::save_predictor((vw *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                       in_stack_fffffffffffffc48);
    std::__cxx11::string::~string(local_1f0);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Number of examples with at least one query = ");
    std::ostream::operator<<(poVar3,*(ulong *)(local_8 + 0x1a));
    *(long *)(local_8 + 8) = *(long *)(local_8 + 8) << 1;
    for (local_1f8 = 0; uVar2 = local_1f8,
        sVar4 = v_array<unsigned_long>::size((v_array<unsigned_long> *)(local_8 + 0x1e)),
        uVar2 < sVar4; local_1f8 = local_1f8 + 1) {
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"examples with ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1f8);
      poVar3 = std::operator<<(poVar3," labels queried = ");
      puVar5 = v_array<unsigned_long>::operator[]
                         ((v_array<unsigned_long> *)(local_8 + 0x1e),local_1f8);
      std::ostream::operator<<(poVar3,*puVar5);
    }
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"labels outside of cost range = ");
    std::ostream::operator<<(poVar3,*(ulong *)(local_8 + 0x26));
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"average distance to range = ");
    local_384 = (float)*(ulong *)(local_8 + 0x26);
    std::ostream::operator<<(poVar3,local_8[0x28] / local_384);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    in_stack_fffffffffffffc60 = std::operator<<(poVar3,"average range = ");
    in_stack_fffffffffffffc54 = local_8[0x29];
    local_3a4 = (float)*(ulong *)(local_8 + 0x26);
    std::ostream::operator<<(in_stack_fffffffffffffc60,in_stack_fffffffffffffc54 / local_3a4);
    in_stack_fffffffffffffc48 =
         (string *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(in_stack_fffffffffffffc48,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  if (*(ulong *)**(undefined8 **)(local_8 + 0xe) < *(long *)(local_8 + 10) * (ulong)(uint)local_8[4]
     ) {
    local_1fc = 1;
    local_210[4] = 3.4028235e+38;
    local_210[1] = 0.0;
    local_210[2] = 0.0;
    local_210[3] = 0.0;
    *(undefined4 *)(local_18 + 0x6830) = 0;
    *(undefined8 *)(local_18 + 0x6828) = 0;
    local_210[0] = 3.4028235e+38;
    fVar13 = (float)(long)*(ulong *)(local_8 + 6);
    fVar15 = (float)*(ulong *)(local_8 + 6);
    local_218 = fVar15 + -1.0;
    fVar9 = local_8[1] * (local_8[2] - local_8[3]);
    local_214 = fVar15;
    dVar11 = std::sqrt((double)(ulong)(uint)fVar15);
    local_21c = fVar9 / SUB84(dVar11,0);
    eta_00 = *local_8;
    fVar10 = (float)(uint)local_8[4];
    local_224 = 1.0;
    pfVar6 = std::max<float>(&local_218,&local_224);
    dVar11 = std::log((double)(ulong)(uint)(fVar10 * *pfVar6));
    dVar11 = (double)(eta_00 * SUB84(dVar11,0));
    _Var12 = std::pow<float,int>(0.0,0x2f8fa7);
    local_220 = (float)(dVar11 * _Var12);
    sVar4 = v_array<COST_SENSITIVE::wclass>::size(&local_38);
    if (sVar4 == 0) {
      local_2e8 = 0.0;
      local_2e9 = 0;
      local_2ea = 0;
      for (local_2f0 = 1.4013e-45; (uint)local_2f0 <= (uint)local_8[4];
          local_2f0 = (float)((int)local_2f0 + 1)) {
        inner_loop<false,true>
                  ((cs_active *)CONCAT44(eta_00,fVar10),
                   (single_learner *)
                   CONCAT44(fVar9,CONCAT13(in_stack_fffffffffffffc2b,
                                           CONCAT12(in_stack_fffffffffffffc2a,
                                                    CONCAT11(in_stack_fffffffffffffc29,
                                                             in_stack_fffffffffffffc28)))),
                   in_stack_fffffffffffffc20,(uint32_t)((ulong)&local_2ea >> 0x20),
                   SUB84(&local_2ea,0),
                   (uint32_t *)CONCAT44(in_stack_fffffffffffffc14,(uint)(local_2e9 & 1)),&local_2e8,
                   (float *)CONCAT44(fVar15,fVar13),false,
                   (bool *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      }
    }
    else {
      local_230 = &local_38;
      ppwVar7 = v_array<COST_SENSITIVE::wclass>::begin(local_230);
      local_238 = *ppwVar7;
      ppwVar7 = v_array<COST_SENSITIVE::wclass>::end(local_230);
      local_240 = *ppwVar7;
      for (; local_238 != local_240; local_238 = local_238 + 1) {
        local_248 = local_238;
        local_260 = 0;
        local_25c = 0;
        local_258 = 0;
        local_257 = 0;
        local_256 = 0;
        local_250 = local_238;
        v_array<lq_data>::push_back
                  ((v_array<lq_data> *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                   ,in_stack_fffffffffffffc08);
      }
      local_264 = 0;
      local_270 = (v_array<lq_data> *)(local_8 + 0x12);
      pplVar8 = v_array<lq_data>::begin(local_270);
      local_278 = *pplVar8;
      pplVar8 = v_array<lq_data>::end(local_270);
      local_280 = *pplVar8;
      for (; local_278 != local_280; local_278 = local_278 + 1) {
        local_288 = local_278;
        find_cost_range((cs_active *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                        (single_learner *)in_stack_fffffffffffffc48,
                        (example *)CONCAT44(fVar15,fVar13),(uint32_t)((ulong)dVar11 >> 0x20),
                        SUB84(dVar11,0),eta_00,
                        (float *)CONCAT44(fVar9,CONCAT13(in_stack_fffffffffffffc2b,
                                                         CONCAT12(in_stack_fffffffffffffc2a,
                                                                  CONCAT11(in_stack_fffffffffffffc29
                                                                           ,
                                                  in_stack_fffffffffffffc28)))),
                        (float *)in_stack_fffffffffffffc20,(bool *)in_stack_fffffffffffffc60);
        pfVar6 = std::min<float>(local_210,&local_288->max_pred);
        local_210[0] = *pfVar6;
      }
      local_290 = (v_array<lq_data> *)(local_8 + 0x12);
      pplVar8 = v_array<lq_data>::begin(local_290);
      local_298 = *pplVar8;
      pplVar8 = v_array<lq_data>::end(local_290);
      local_2a0 = *pplVar8;
      for (; local_298 != local_2a0; local_298 = local_298 + 1) {
        local_2a8 = local_298;
        local_298->is_range_overlapped = local_298->min_pred <= local_210[0];
        local_264 = (local_298->is_range_overlapped & 1) + local_264;
        in_stack_fffffffffffffc2b = 0;
        if ((local_298->is_range_overlapped & 1U) != 0) {
          in_stack_fffffffffffffc2b = local_298->is_range_large ^ 0xff;
        }
        *(ulong *)(local_8 + 0x1c) =
             (ulong)(in_stack_fffffffffffffc2b & 1) + *(long *)(local_8 + 0x1c);
        fVar1 = local_298->cl->x;
        if ((local_298->max_pred <= fVar1 && fVar1 != local_298->max_pred) ||
           (local_298->cl->x < local_298->min_pred)) {
          *(long *)(local_8 + 0x26) = *(long *)(local_8 + 0x26) + 1;
          local_2ac = local_298->cl->x - local_298->max_pred;
          local_2b0 = local_298->min_pred - local_298->cl->x;
          pfVar6 = std::max<float>(&local_2ac,&local_2b0);
          local_8[0x28] = *pfVar6 + local_8[0x28];
          local_8[0x29] = (local_2a8->max_pred - local_2a8->min_pred) + local_8[0x29];
        }
      }
      local_2b1 = 1 < local_264;
      local_2c0 = *(long *)**(undefined8 **)(local_8 + 0xe);
      local_2c8 = (v_array<lq_data> *)(local_8 + 0x12);
      pplVar8 = v_array<lq_data>::begin(local_2c8);
      local_2d0 = *pplVar8;
      pplVar8 = v_array<lq_data>::end(local_2c8);
      local_2d8 = *pplVar8;
      for (; local_2d0 != local_2d8; local_2d0 = local_2d0 + 1) {
        local_2e0 = local_2d0;
        if (((((local_2b1 & 1) == 0) || (bVar14 = 1, (*(byte *)((long)local_8 + 0x31) & 1) == 0)) &&
            (((*(byte *)((long)local_8 + 0x32) & 1) != 0 ||
             (bVar14 = 1, (local_2d0->is_range_large & 1U) == 0)))) &&
           ((in_stack_fffffffffffffc29 = 0, bVar14 = in_stack_fffffffffffffc29, (local_2b1 & 1) != 0
            && (in_stack_fffffffffffffc29 = 0, bVar14 = in_stack_fffffffffffffc29,
               (local_2d0->is_range_overlapped & 1U) != 0)))) {
          in_stack_fffffffffffffc29 = local_2d0->is_range_large;
          bVar14 = in_stack_fffffffffffffc29;
        }
        local_2e1 = bVar14 & 1;
        pfVar6 = &local_2d0->cl->partial_prediction;
        in_stack_fffffffffffffc10 = (uint)local_2e1;
        inner_loop<false,true>
                  ((cs_active *)CONCAT44(eta_00,fVar10),
                   (single_learner *)
                   CONCAT44(fVar9,CONCAT13(in_stack_fffffffffffffc2b,
                                           CONCAT12(bVar14,CONCAT11(in_stack_fffffffffffffc29,
                                                                    in_stack_fffffffffffffc28)))),
                   in_stack_fffffffffffffc20,(uint32_t)((ulong)&local_2d0->query_needed >> 0x20),
                   SUB84(&local_2d0->query_needed,0),
                   (uint32_t *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),pfVar6,
                   (float *)CONCAT44(fVar15,fVar13),false,
                   (bool *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        if ((local_2e0->query_needed & 1U) != 0) {
          v_array<unsigned_int>::push_back
                    ((v_array<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),(uint *)pfVar6);
        }
        if (((uint)local_8[0xc] & 1) != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"label=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2e0->cl->class_index);
          poVar3 = std::operator<<(poVar3," x=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2e0->cl->x);
          poVar3 = std::operator<<(poVar3," prediction=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1fc);
          poVar3 = std::operator<<(poVar3," score=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_210[4]);
          poVar3 = std::operator<<(poVar3," pp=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2e0->cl->partial_prediction);
          poVar3 = std::operator<<(poVar3," ql=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(local_2e1 & 1));
          poVar3 = std::operator<<(poVar3," qn=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(local_2e0->query_needed & 1));
          poVar3 = std::operator<<(poVar3," ro=");
          poVar3 = (ostream *)
                   std::ostream::operator<<(poVar3,(bool)(local_2e0->is_range_overlapped & 1));
          poVar3 = std::operator<<(poVar3," rl=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(local_2e0->is_range_large & 1))
          ;
          poVar3 = std::operator<<(poVar3," [");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2e0->min_pred);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2e0->max_pred);
          poVar3 = std::operator<<(poVar3,"] vs delta=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_220);
          poVar3 = std::operator<<(poVar3," n_overlapped=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_264);
          poVar3 = std::operator<<(poVar3," is_baseline=");
          this = (void *)std::ostream::operator<<
                                   (poVar3,(bool)(*(byte *)((long)local_8 + 0x31) & 1));
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        }
      }
      v_array<lq_data>::delete_v
                ((v_array<lq_data> *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      if (*(long *)**(undefined8 **)(local_8 + 0xe) != local_2c0) {
        *(long *)(local_8 + 0x1a) = *(long *)(local_8 + 0x1a) + 1;
      }
      puVar5 = v_array<unsigned_long>::operator[]
                         ((v_array<unsigned_long> *)(local_8 + 0x1e),
                          *(long *)**(undefined8 **)(local_8 + 0xe) - local_2c0);
      *puVar5 = *puVar5 + 1;
      *(float *)(local_18 + 0x68a8) = local_210[4];
    }
    *(uint *)(local_18 + 0x6850) = local_1fc;
    *(wclass **)(local_18 + 0x6828) = local_38._begin;
    *(wclass **)(local_18 + 0x6830) = local_38._end;
    *(wclass **)(local_18 + 0x6838) = local_38.end_array;
    *(size_t *)(local_18 + 0x6840) = local_38.erase_count;
  }
  return;
}

Assistant:

void predict_or_learn(cs_active& cs_a, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;

  // cerr << "is_learn=" << is_learn << " ld.costs.size()=" << ld.costs.size() << endl;
  if (cs_a.all->sd->queries >= cs_a.min_labels * cs_a.num_classes)
  {
    // save regressor
    stringstream filename;
    filename << cs_a.all->final_regressor_name << "." << ec.example_counter << "." << cs_a.all->sd->queries << "."
             << cs_a.num_any_queries;
    VW::save_predictor(*(cs_a.all), filename.str());
    cerr << endl << "Number of examples with at least one query = " << cs_a.num_any_queries;
    // Double label query budget
    cs_a.min_labels *= 2;
    for (size_t i = 0; i < cs_a.examples_by_queries.size(); i++)
    {
      cerr << endl << "examples with " << i << " labels queried = " << cs_a.examples_by_queries[i];
    }

    cerr << endl << "labels outside of cost range = " << cs_a.labels_outside_range;
    cerr << endl << "average distance to range = " << cs_a.distance_to_range / ((float)cs_a.labels_outside_range);
    cerr << endl << "average range = " << cs_a.range / ((float)cs_a.labels_outside_range);

    /*
    for (size_t i=0; i<cs_a.all->sd->distance_to_range.size(); i++)
    {  cerr << endl << "label " << i << ", average distance to range = " <<
    cs_a.all->sd->distance_to_range[i]/((float)(cs_a.t-1));
    }*/

    cerr << endl << endl;
  }

  if (cs_a.all->sd->queries >= cs_a.max_labels * cs_a.num_classes)
    return;

  uint32_t prediction = 1;
  float score = FLT_MAX;
  ec.l.simple = {0., 0., 0.};

  float min_max_cost = FLT_MAX;
  float t = (float)cs_a.t;  // ec.example_t;  // current round
  float t_prev = t - 1.f;   // ec.weight; // last round

  float eta = cs_a.c1 * (cs_a.cost_max - cs_a.cost_min) / sqrt(t);  // threshold on cost range
  float delta = cs_a.c0 * log((float)(cs_a.num_classes * max(t_prev, 1.f))) *
      pow(cs_a.cost_max - cs_a.cost_min, 2);  // threshold on empirical loss difference

  if (ld.costs.size() > 0)
  {
    // Create metadata structure
    for (COST_SENSITIVE::wclass& cl : ld.costs)
    {
      lq_data f = {0.0, 0.0, 0, 0, 0, cl};
      cs_a.query_data.push_back(f);
    }
    uint32_t n_overlapped = 0;
    for (lq_data& lqd : cs_a.query_data)
    {
      find_cost_range(cs_a, base, ec, lqd.cl.class_index, delta, eta, lqd.min_pred, lqd.max_pred, lqd.is_range_large);
      min_max_cost = min(min_max_cost, lqd.max_pred);
    }
    for (lq_data& lqd : cs_a.query_data)
    {
      lqd.is_range_overlapped = (lqd.min_pred <= min_max_cost);
      n_overlapped += (uint32_t)(lqd.is_range_overlapped);
      // large_range = large_range || (cl.is_range_overlapped && cl.is_range_large);
      // if(cl.is_range_overlapped && is_learn)
      //{ cout << "label " << cl.class_index << ", min_pred = " << cl.min_pred << ", max_pred = " << cl.max_pred << ",
      // is_range_large = " << cl.is_range_large << ", eta = " << eta << ", min_max_cost = " << min_max_cost << endl;
      //}
      cs_a.overlapped_and_range_small += (size_t)(lqd.is_range_overlapped && !lqd.is_range_large);
      if (lqd.cl.x > lqd.max_pred || lqd.cl.x < lqd.min_pred)
      {
        cs_a.labels_outside_range++;
        // cs_a.all->sd->distance_to_range[cl.class_index-1] += max(cl.x - cl.max_pred, cl.min_pred - cl.x);
        cs_a.distance_to_range += max(lqd.cl.x - lqd.max_pred, lqd.min_pred - lqd.cl.x);
        cs_a.range += lqd.max_pred - lqd.min_pred;
      }
    }

    bool query = (n_overlapped > 1);
    size_t queries = cs_a.all->sd->queries;
    // bool any_query = false;
    for (lq_data& lqd : cs_a.query_data)
    {
      bool query_label = ((query && cs_a.is_baseline) || (!cs_a.use_domination && lqd.is_range_large) ||
          (query && lqd.is_range_overlapped && lqd.is_range_large));
      inner_loop<is_learn, is_simulation>(cs_a, base, ec, lqd.cl.class_index, lqd.cl.x, prediction, score,
          lqd.cl.partial_prediction, query_label, lqd.query_needed);
      if (lqd.query_needed)
        ec.pred.multilabels.label_v.push_back(lqd.cl.class_index);
      if (cs_a.print_debug_stuff)
        cerr << "label=" << lqd.cl.class_index << " x=" << lqd.cl.x << " prediction=" << prediction
             << " score=" << score << " pp=" << lqd.cl.partial_prediction << " ql=" << query_label
             << " qn=" << lqd.query_needed << " ro=" << lqd.is_range_overlapped << " rl=" << lqd.is_range_large << " ["
             << lqd.min_pred << ", " << lqd.max_pred << "] vs delta=" << delta << " n_overlapped=" << n_overlapped
             << " is_baseline=" << cs_a.is_baseline << endl;
    }

    // Need to pop metadata
    cs_a.query_data.delete_v();

    if (cs_a.all->sd->queries - queries > 0)
      cs_a.num_any_queries++;

    cs_a.examples_by_queries[cs_a.all->sd->queries - queries] += 1;
    // if(any_query)
    // cs_a.num_any_queries++;

    ec.partial_prediction = score;
    if (is_learn)
    {
      cs_a.t++;
    }
  }
  else
  {
    float temp = 0.f;
    bool temp2 = false, temp3 = false;
    for (uint32_t i = 1; i <= cs_a.num_classes; i++)
    {
      inner_loop<false, is_simulation>(cs_a, base, ec, i, FLT_MAX, prediction, score, temp, temp2, temp3);
    }
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}